

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O0

void __thiscall
DISTRHO::PluginExporter::run(PluginExporter *this,float **inputs,float **outputs,uint32_t frames)

{
  uint32_t frames_local;
  float **outputs_local;
  float **inputs_local;
  PluginExporter *this_local;
  
  if (this->fData == (PrivateData *)0x0) {
    d_safe_assert("fData != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
                  ,0x354);
  }
  else if (this->fPlugin == (Plugin *)0x0) {
    d_safe_assert("fPlugin != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
                  ,0x355);
  }
  else {
    if ((this->fIsActive & 1U) == 0) {
      this->fIsActive = true;
      (*this->fPlugin->_vptr_Plugin[0xf])();
    }
    this->fData->isProcessing = true;
    (*this->fPlugin->_vptr_Plugin[0x11])(this->fPlugin,inputs,outputs,(ulong)frames);
    this->fData->isProcessing = false;
  }
  return;
}

Assistant:

void run(const float** const inputs, float** const outputs, const uint32_t frames)
    {
        DISTRHO_SAFE_ASSERT_RETURN(fData != nullptr,);
        DISTRHO_SAFE_ASSERT_RETURN(fPlugin != nullptr,);

        if (! fIsActive)
        {
            fIsActive = true;
            fPlugin->activate();
        }

        fData->isProcessing = true;
        fPlugin->run(inputs, outputs, frames);
        fData->isProcessing = false;
    }